

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesNode.cpp
# Opt level: O1

void __thiscall
chrono::ChVariablesNode::Compute_inc_Mb_v
          (ChVariablesNode *this,ChVectorRef *result,ChVectorConstRef vect)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  PointerType pdVar6;
  ulong *puVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  lVar4 = *(long *)&(result->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ).field_0x8;
  iVar8 = (*(this->super_ChVariables)._vptr_ChVariables[2])();
  if (lVar4 != iVar8) {
    __assert_fail("result.size() == Get_ndof()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesNode.cpp"
                  ,0x40,
                  "virtual void chrono::ChVariablesNode::Compute_inc_Mb_v(ChVectorRef, ChVectorConstRef) const"
                 );
  }
  lVar4 = (vect->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value;
  iVar8 = (*(this->super_ChVariables)._vptr_ChVariables[2])(this);
  if (lVar4 != iVar8) {
    __assert_fail("vect.size() == Get_ndof()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesNode.cpp"
                  ,0x41,
                  "virtual void chrono::ChVariablesNode::Compute_inc_Mb_v(ChVectorRef, ChVectorConstRef) const"
                 );
  }
  lVar4 = (vect->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value;
  if (0 < lVar4) {
    lVar5 = *(long *)&(result->
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                      ).field_0x8;
    if (0 < lVar5) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = this->mass;
      pdVar6 = (vect->
               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ).
               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               .m_data;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *pdVar6;
      puVar7 = *(ulong **)
                &result->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      ;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *puVar7;
      auVar1 = vfmadd213sd_fma(auVar12,auVar9,auVar1);
      *puVar7 = auVar1._0_8_;
      if (lVar4 == 1) goto LAB_007fe9f2;
      if (lVar5 != 1) {
        auVar10._8_8_ = 0;
        auVar10._0_8_ = this->mass;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = pdVar6[1];
        auVar2._8_8_ = 0;
        auVar2._0_8_ = puVar7[1];
        auVar1 = vfmadd213sd_fma(auVar13,auVar10,auVar2);
        puVar7[1] = auVar1._0_8_;
        if (lVar4 < 3) goto LAB_007fe9f2;
        if (2 < lVar5) {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = this->mass;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = pdVar6[2];
          auVar3._8_8_ = 0;
          auVar3._0_8_ = puVar7[2];
          auVar1 = vfmadd213sd_fma(auVar14,auVar11,auVar3);
          puVar7[2] = auVar1._0_8_;
          return;
        }
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
                 );
  }
LAB_007fe9f2:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, 0>::operator()(Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
               );
}

Assistant:

void ChVariablesNode::Compute_inc_Mb_v(ChVectorRef result, ChVectorConstRef vect) const {
    assert(result.size() == Get_ndof());
    assert(vect.size() == Get_ndof());

    // optimized unrolled operations
    result(0) += mass * vect(0);
    result(1) += mass * vect(1);
    result(2) += mass * vect(2);
}